

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O1

int __thiscall
GrcFont::GetGlyfContours(GrcFont *this,gid16 wGlyphID,vector<int,_std::allocator<int>_> *pvnEndPt)

{
  bool bVar1;
  int *prgnContourEndPoint;
  uint uVar2;
  size_t cContours;
  size_t cTmpCnt;
  ulong local_40;
  ulong local_38;
  
  bVar1 = TtfUtil::GlyfContourCount
                    (wGlyphID,this->m_pGlyf,this->m_pLoca,this->m_cLoca,this->m_pHead,&local_40);
  local_38 = local_40;
  uVar2 = 0;
  if (bVar1) {
    prgnContourEndPoint = (int *)operator_new__(-(ulong)(local_40 >> 0x3e != 0) | local_40 * 4);
    bVar1 = TtfUtil::GlyfContourEndPoints
                      (wGlyphID,this->m_pGlyf,this->m_pLoca,this->m_cLoca,this->m_pHead,
                       prgnContourEndPoint,&local_38);
    if (bVar1) {
      std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
                ((vector<int,std::allocator<int>> *)pvnEndPt,prgnContourEndPoint,
                 prgnContourEndPoint + local_40);
    }
    uVar2 = (uint)bVar1;
    operator_delete__(prgnContourEndPoint);
  }
  return uVar2;
}

Assistant:

int GrcFont::GetGlyfContours(gid16 wGlyphID, std::vector<int> * pvnEndPt)
{
	Assert(m_pFile);
	Assert(m_pGlyf);
	Assert(m_pLoca);
	Assert(m_pHead);

	size_t cContours;

// these checks are actually done by GlyfContourCount
// they're only needed if a specific error msg needs to be generated
#if 0 
	if (TtfUtil::IsSpace(wGlyphID, m_pLoca, m_cLoca, m_pHead))
		return false;

	if (TtfUtil::IsDeepComposite(wGlyphID, m_pGlyf, m_pLoca, m_cLoca, m_pHead))
		return false;
#endif

	if (!TtfUtil::GlyfContourCount(wGlyphID, m_pGlyf, m_pLoca, m_cLoca, m_pHead, cContours))
		return false;

	int * rgnEndPt = new int[cContours];
	size_t cTmpCnt = cContours;

	if (!TtfUtil::GlyfContourEndPoints(wGlyphID, m_pGlyf, m_pLoca, m_cLoca, m_pHead, 
		rgnEndPt, cTmpCnt))
	{
		delete[] rgnEndPt;
		return false;
	}

	pvnEndPt->assign(rgnEndPt, rgnEndPt + cContours);
	delete[] rgnEndPt;

	return true;
}